

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

void __thiscall xray_re::xr_object::save_object(xr_object *this,xr_writer *w)

{
  f_w_const<xray_re::xr_mesh> write;
  f_w_const<xray_re::xr_surface> write_00;
  f_w_const<xray_re::xr_bone> write_01;
  f_w_const<xray_re::xr_skl_motion> write_02;
  f_w_const<xray_re::xr_partition> write_03;
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  mem_func in_stack_fffffffffffffed8;
  xr_writer *pxVar4;
  undefined8 in_stack_fffffffffffffee0;
  xr_writer *this_00;
  f_w_const<xray_re::xr_partition> local_a8;
  undefined8 local_98;
  undefined8 local_90;
  f_w_const<xray_re::xr_skl_motion> local_88;
  code *local_78;
  undefined8 local_70;
  f_w_const<xray_re::xr_bone> local_68;
  code *local_58;
  undefined8 local_50;
  f_w_const<xray_re::xr_surface> local_48;
  code *local_38;
  undefined8 local_30;
  f_w_const<xray_re::xr_mesh> local_28;
  xr_writer *local_18;
  xr_writer *w_local;
  xr_object *this_local;
  
  local_18 = w;
  w_local = (xr_writer *)this;
  xr_writer::w_chunk<unsigned_short>(w,0x900,&EOBJ_VERSION);
  xr_writer::w_chunk(local_18,0x912,&this->m_userdata);
  xr_writer::w_chunk(local_18,0x925,&this->m_lod_ref);
  xr_writer::w_chunk<unsigned_int>(local_18,0x903,&this->m_flags);
  xr_writer::open_chunk(local_18,0x910);
  pxVar4 = local_18;
  local_38 = xr_mesh::save;
  local_30 = 0;
  xr_writer::f_w_const<xray_re::xr_mesh>::f_w_const(&local_28,0x1e5090);
  write._8_8_ = in_stack_fffffffffffffee0;
  write.m_f = in_stack_fffffffffffffed8;
  xr_writer::
  w_chunks<std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>,xray_re::xr_writer::f_w_const<xray_re::xr_mesh>>
            (pxVar4,&this->m_meshes,write);
  xr_writer::close_chunk(local_18);
  xr_writer::open_chunk(local_18,0x907);
  pxVar4 = local_18;
  sVar2 = std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::size
                    (&this->m_surfaces);
  xr_writer::w_size_u32(pxVar4,sVar2);
  pxVar4 = local_18;
  local_58 = xr_surface::save;
  local_50 = 0;
  xr_writer::f_w_const<xray_re::xr_surface>::f_w_const(&local_48,0x22d820);
  write_00._8_8_ = in_stack_fffffffffffffee0;
  write_00.m_f = in_stack_fffffffffffffed8;
  xr_writer::
  w_seq<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>,xray_re::xr_writer::f_w_const<xray_re::xr_surface>>
            (pxVar4,&this->m_surfaces,write_00);
  xr_writer::close_chunk(local_18);
  bVar1 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::empty
                    (&this->m_bones);
  if (!bVar1) {
    xr_writer::open_chunk(local_18,0x921);
    pxVar4 = local_18;
    local_78 = xr_bone::save;
    local_70 = 0;
    xr_writer::f_w_const<xray_re::xr_bone>::f_w_const(&local_68,0x235a10);
    write_01._8_8_ = in_stack_fffffffffffffee0;
    write_01.m_f = in_stack_fffffffffffffed8;
    xr_writer::
    w_chunks<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_writer::f_w_const<xray_re::xr_bone>>
              (pxVar4,&this->m_bones,write_01);
    xr_writer::close_chunk(local_18);
  }
  bVar1 = std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::empty
                    (&this->m_motions);
  if (!bVar1) {
    xr_writer::open_chunk(local_18,0x916);
    pxVar4 = local_18;
    sVar2 = std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::size
                      (&this->m_motions);
    xr_writer::w_size_u32(pxVar4,sVar2);
    pxVar4 = local_18;
    local_90 = 0;
    local_98 = 0x19;
    xr_writer::f_w_const<xray_re::xr_skl_motion>::f_w_const(&local_88,0x19);
    write_02._8_8_ = in_stack_fffffffffffffee0;
    write_02.m_f = in_stack_fffffffffffffed8;
    xr_writer::
    w_seq<std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>,xray_re::xr_writer::f_w_const<xray_re::xr_skl_motion>>
              (pxVar4,&this->m_motions,write_02);
    xr_writer::close_chunk(local_18);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    xr_writer::w_chunk(local_18,0x924,&this->m_motion_refs);
  }
  bVar1 = std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::empty
                    (&this->m_partitions);
  if (!bVar1) {
    xr_writer::open_chunk(local_18,0x923);
    pxVar4 = local_18;
    sVar2 = std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::size
                      (&this->m_partitions);
    xr_writer::w_size_u32(pxVar4,sVar2);
    this_00 = local_18;
    xr_writer::f_w_const<xray_re::xr_partition>::f_w_const(&local_a8,0x236430);
    write_03._8_8_ = this_00;
    write_03.m_f = (mem_func)pxVar4;
    xr_writer::
    w_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,xray_re::xr_writer::f_w_const<xray_re::xr_partition>>
              (this_00,&this->m_partitions,write_03);
    xr_writer::close_chunk(local_18);
  }
  if ((this->m_flags & 1) != 0) {
    xr_writer::open_chunk(local_18,0x920);
    xr_writer::w_fvector3(local_18,&this->m_position);
    xr_writer::w_fvector3(local_18,&this->m_rotation);
    xr_writer::close_chunk(local_18);
  }
  xr_writer::open_chunk(local_18,0x922);
  xr_writer::w_sz(local_18,&this->m_owner_name);
  xr_writer::w_u32(local_18,this->m_creation_time);
  xr_writer::w_sz(local_18,&this->m_modif_name);
  xr_writer::w_u32(local_18,this->m_modified_time);
  xr_writer::close_chunk(local_18);
  return;
}

Assistant:

void xr_object::save_object(xr_writer& w) const
{
	w.w_chunk<uint16_t>(EOBJ_CHUNK_VERSION, EOBJ_VERSION);

	w.w_chunk(EOBJ_CHUNK_USERDATA, m_userdata);

	w.w_chunk(EOBJ_CHUNK_LOD_REF, m_lod_ref);

	w.w_chunk<uint32_t>(EOBJ_CHUNK_FLAGS, m_flags);

	w.open_chunk(EOBJ_CHUNK_MESHES);
	w.w_chunks(m_meshes, xr_writer::f_w_const<xr_mesh>(&xr_mesh::save));
	w.close_chunk();

	w.open_chunk(EOBJ_CHUNK_SURFACES_2);
	w.w_size_u32(m_surfaces.size());
	w.w_seq(m_surfaces, xr_writer::f_w_const<xr_surface>(&xr_surface::save));
	w.close_chunk();

	if (!m_bones.empty()) {
		w.open_chunk(EOBJ_CHUNK_BONES_1);
		w.w_chunks(m_bones, xr_writer::f_w_const<xr_bone>(&xr_bone::save));
		w.close_chunk();
	}
	if (!m_motions.empty()) {
		w.open_chunk(EOBJ_CHUNK_MOTIONS);
		w.w_size_u32(m_motions.size());
		w.w_seq(m_motions, xr_writer::f_w_const<xr_skl_motion>(&xr_skl_motion::save));
		w.close_chunk();
	}
	if (!m_motion_refs.empty()) {
		w.w_chunk(EOBJ_CHUNK_MOTION_REFS, m_motion_refs);
	}
	if (!m_partitions.empty()) {
		w.open_chunk(EOBJ_CHUNK_PARTITIONS_1);
		w.w_size_u32(m_partitions.size());
		w.w_seq(m_partitions, xr_writer::f_w_const<xr_partition>(&xr_partition::save));
		w.close_chunk();
	}
	if (m_flags & EOF_DYNAMIC) {
		w.open_chunk(EOBJ_CHUNK_TRANSFORM);
		w.w_fvector3(m_position);
		w.w_fvector3(m_rotation);
		w.close_chunk();
	}

	w.open_chunk(EOBJ_CHUNK_REVISION);
	w.w_sz(m_owner_name);
	w.w_u32(m_creation_time);
	w.w_sz(m_modif_name);
	w.w_u32(m_modified_time);
	w.close_chunk();
}